

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O2

char * lws_urlencode(char *escaped,char *string,int len)

{
  byte bVar1;
  char *pcVar2;
  char *p;
  char *q;
  
  pcVar2 = escaped;
  do {
    bVar1 = *string;
    if ((bVar1 == 0) || (len < 4)) {
      *escaped = 0;
      return pcVar2;
    }
    if (bVar1 == 0x20) {
      *escaped = 0x2b;
LAB_0010bf99:
      escaped = (char *)((byte *)escaped + 1);
      len = len + -1;
    }
    else {
      if (((byte)(bVar1 - 0x30) < 10) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
        *escaped = bVar1;
        goto LAB_0010bf99;
      }
      *escaped = 0x25;
      ((byte *)escaped)[1] = "0123456789ABCDEF"[(byte)*string >> 4];
      ((byte *)escaped)[2] = "0123456789ABCDEF"[(byte)*string & 0xf];
      escaped = (char *)((byte *)escaped + 3);
      len = len + -3;
    }
    string = (char *)((byte *)string + 1);
  } while( true );
}

Assistant:

const char *
lws_urlencode(char *escaped, const char *string, int len)
{
	const char *p = string;
	char *q = escaped;

	while (*p && len-- > 3) {
		if (*p == ' ') {
			*q++ = '+';
			p++;
			continue;
		}
		if ((*p >= '0' && *p <= '9') ||
		    (*p >= 'A' && *p <= 'Z') ||
		    (*p >= 'a' && *p <= 'z')) {
			*q++ = *p++;
			continue;
		}
		*q++ = '%';
		*q++ = hex[(*p >> 4) & 0xf];
		*q++ = hex[*p & 0xf];

		len -= 2;
		p++;
	}
	*q = '\0';

	return escaped;
}